

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

void parse(t_program *program,t_program *parent_program)

{
  bool bVar1;
  int iVar2;
  undefined8 extraout_RAX;
  char *fmt;
  pointer pptVar3;
  string path;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string((string *)&path,(string *)&program->path_);
  std::__cxx11::string::string((string *)&local_68,(string *)&path);
  directory_name(&local_48,&local_68);
  std::__cxx11::string::operator=((string *)&g_curdir_abi_cxx11_,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::_M_assign((string *)&g_curpath_abi_cxx11_);
  yyin = (FILE *)fopen(path._M_dataplus._M_p,"r");
  if ((FILE *)yyin == (FILE *)0x0) {
LAB_0013162e:
    failure("Could not open input file: \"%s\"",path._M_dataplus._M_p);
  }
  else {
    bVar1 = skip_utf8_bom(yyin);
    if (bVar1) {
      pverbose("Skipped UTF-8 BOM at %s\n",path._M_dataplus._M_p);
    }
    pverbose("Scanning %s for includes\n",path._M_dataplus._M_p);
    yylineno = INCLUDES;
    g_scope = program->scope_;
    g_program = program;
    g_parse_mode = yylineno;
    iVar2 = yyparse();
    if (iVar2 == 0) {
      fclose((FILE *)yyin);
      for (pptVar3 = (program->includes_).
                     super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          pptVar3 !=
          (program->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl
          .super__Vector_impl_data._M_finish; pptVar3 = pptVar3 + 1) {
        parse(*pptVar3,program);
      }
      reset_program_doctext_info();
      g_parse_mode = PROGRAM;
      g_scope = program->scope_;
      if (parent_program == (t_program *)0x0) {
        g_parent_scope = (t_scope *)0x0;
      }
      else {
        g_parent_scope = parent_program->scope_;
      }
      g_program = program;
      std::operator+(&local_48,&program->name_,".");
      std::__cxx11::string::operator=((string *)&g_parent_prefix_abi_cxx11_,(string *)&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::_M_assign((string *)&g_curpath_abi_cxx11_);
      yyin = (FILE *)fopen(path._M_dataplus._M_p,"r");
      if ((FILE *)yyin != (FILE *)0x0) {
        bVar1 = skip_utf8_bom(yyin);
        if (bVar1) {
          pverbose("Skipped UTF-8 BOM at %s\n",path._M_dataplus._M_p);
        }
        pverbose("Parsing %s for types\n",path._M_dataplus._M_p);
        yylineno = 1;
        iVar2 = yyparse();
        if (iVar2 == 0) {
          fclose((FILE *)yyin);
          std::__cxx11::string::~string((string *)&path);
          return;
        }
        fmt = "Parser error during types pass.";
        goto LAB_0013166b;
      }
      goto LAB_0013162e;
    }
  }
  fmt = "Parser error during include pass.";
LAB_0013166b:
  failure(fmt);
  std::__cxx11::string::~string((string *)&path);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void parse(t_program *program, t_program *parent_program) {
    // Get scope file path
    string path = program->get_path();

    // Set current dir global, which is used in the include_file function
    g_curdir = directory_name(path);
    g_curpath = path;

    // Open the file
    // skip UTF-8 BOM if there is one
    yyin = fopen(path.c_str(), "r");
    if (yyin == 0) {
        failure("Could not open input file: \"%s\"", path.c_str());
    }
    if (skip_utf8_bom(yyin))
        pverbose("Skipped UTF-8 BOM at %s\n", path.c_str());

    // Create new scope and scan for includes
    pverbose("Scanning %s for includes\n", path.c_str());
    g_parse_mode = INCLUDES;
    g_program = program;
    g_scope = program->scope();
    try {
        yylineno = 1;
        if (yyparse() != 0) {
            failure("Parser error during include pass.");
        }
    } catch (string &x) {
        failure(x.c_str());
    }
    fclose(yyin);

    // Recursively parse all the include programs
    vector<t_program *> &includes = program->get_includes();
    vector<t_program *>::iterator iter;
    for (iter = includes.begin(); iter != includes.end(); ++iter) {
        parse(*iter, program);
    }

    // reset program doctext status before parsing a new file
    reset_program_doctext_info();

    // Parse the program file
    g_parse_mode = PROGRAM;
    g_program = program;
    g_scope = program->scope();
    g_parent_scope = (parent_program != nullptr) ? parent_program->scope() : nullptr;
    g_parent_prefix = program->get_name() + ".";
    g_curpath = path;

    // Open the file
    // skip UTF-8 BOM if there is one
    yyin = fopen(path.c_str(), "r");
    if (yyin == 0) {
        failure("Could not open input file: \"%s\"", path.c_str());
    }
    if (skip_utf8_bom(yyin))
        pverbose("Skipped UTF-8 BOM at %s\n", path.c_str());

    pverbose("Parsing %s for types\n", path.c_str());
    yylineno = 1;
    try {
        if (yyparse() != 0) {
            failure("Parser error during types pass.");
        }
    } catch (string &x) {
        failure(x.c_str());
    }
    fclose(yyin);
}